

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

CordRepKind __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::RepRef::tag(RepRef *this)

{
  byte bVar1;
  
  if (this->rep == (CordRep *)0x0) {
    return UNUSED_0;
  }
  bVar1 = this->rep->tag;
  if (bVar1 != 0) {
    return (CordRepKind)bVar1;
  }
  __assert_fail("false && \"rep == nullptr || rep->tag != CordRepKind::UNUSED_0\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0x87,
                "auto absl::cord_internal::(anonymous namespace)::CordRepAnalyzer::RepRef::tag()::(anonymous class)::operator()() const"
               );
}

Assistant:

constexpr CordRepKind tag() const {
      ABSL_ASSERT(rep == nullptr || rep->tag != CordRepKind::UNUSED_0);
      return rep ? static_cast<CordRepKind>(rep->tag) : CordRepKind::UNUSED_0;
    }